

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_function.hpp
# Opt level: O2

void __thiscall
duckdb::AggregateFunction::AggregateFunction
          (AggregateFunction *this,vector<duckdb::LogicalType,_true> *arguments,
          LogicalType *return_type,aggregate_size_t state_size,aggregate_initialize_t initialize,
          aggregate_update_t update,aggregate_combine_t combine,aggregate_finalize_t finalize,
          aggregate_simple_update_t simple_update,bind_aggregate_function_t bind,
          aggregate_destructor_t destructor,aggregate_statistics_t statistics,
          aggregate_window_t window,aggregate_serialize_t serialize,
          aggregate_deserialize_t deserialize)

{
  string local_28;
  
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  AggregateFunction(this,&local_28,arguments,return_type,state_size,initialize,update,combine,
                    finalize,DEFAULT_NULL_HANDLING,simple_update,bind,destructor,statistics,window,
                    serialize,deserialize);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

AggregateFunction(const vector<LogicalType> &arguments, const LogicalType &return_type, aggregate_size_t state_size,
	                  aggregate_initialize_t initialize, aggregate_update_t update, aggregate_combine_t combine,
	                  aggregate_finalize_t finalize, aggregate_simple_update_t simple_update = nullptr,
	                  bind_aggregate_function_t bind = nullptr, aggregate_destructor_t destructor = nullptr,
	                  aggregate_statistics_t statistics = nullptr, aggregate_window_t window = nullptr,
	                  aggregate_serialize_t serialize = nullptr, aggregate_deserialize_t deserialize = nullptr)
	    : AggregateFunction(string(), arguments, return_type, state_size, initialize, update, combine, finalize,
	                        FunctionNullHandling::DEFAULT_NULL_HANDLING, simple_update, bind, destructor, statistics,
	                        window, serialize, deserialize) {
	}